

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBodyVisitor.hpp
# Opt level: O2

void __thiscall OpenMD::LipidHeadVisitor::~LipidHeadVisitor(LipidHeadVisitor *this)

{
  ~LipidHeadVisitor(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

LipidHeadVisitor(SimInfo* info) : BaseRigidBodyVisitor(info) {
      visitorName = "LipidHeadVisitor";
    }